

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void ** __thiscall icu_63::UVector::toArray(UVector *this,void **result)

{
  int iVar1;
  long lVar2;
  void **a;
  
  iVar1 = this->count;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      *(UElement *)(result + lVar2) = this->elements[lVar2];
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return result;
}

Assistant:

void** UVector::toArray(void** result) const {
    void** a = result;
    for (int i=0; i<count; ++i) {
        *a++ = elements[i].pointer;
    }
    return result;
}